

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O2

void __thiscall
feintrack::SimpleLeftObjectsDetector::~SimpleLeftObjectsDetector(SimpleLeftObjectsDetector *this)

{
  ~SimpleLeftObjectsDetector(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

SimpleLeftObjectsDetector::~SimpleLeftObjectsDetector()
{

}